

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

pair<mjs::token,_unsigned_long> * __thiscall
mjs::anon_unknown_2::skip_whitespace
          (pair<mjs::token,_unsigned_long> *__return_storage_ptr__,anon_unknown_2 *this,
          wstring_view text,size_t token_start,version ver)

{
  bool bVar1;
  pair<mjs::token,_unsigned_long> *extraout_RAX;
  anon_unknown_2 *paVar2;
  anon_unknown_2 *paVar3;
  token local_50;
  
  paVar2 = (anon_unknown_2 *)text._M_str;
  paVar3 = paVar2;
  if (paVar2 < this) {
    do {
      bVar1 = is_whitespace(*(char16_t *)(text._M_len + (long)paVar2 * 4),(version)token_start);
      paVar3 = paVar2;
      if (!bVar1) break;
      paVar2 = paVar2 + 1;
      paVar3 = this;
    } while (this != paVar2);
  }
  local_50.type_ = whitespace;
  (__return_storage_ptr__->first).type_ = eof;
  token::operator=(&__return_storage_ptr__->first,&local_50);
  __return_storage_ptr__->second = (unsigned_long)paVar3;
  token::destroy(&local_50);
  return extraout_RAX;
}

Assistant:

std::pair<token, size_t> skip_whitespace(const std::wstring_view text, const size_t token_start, version ver) {
    auto token_end = token_start;
    while (token_end < text.size() && is_whitespace(static_cast<char16_t>(text[token_end]), ver)) {
        ++token_end;
    }
    return { token{token_type::whitespace}, token_end };
}